

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O3

boolean encode_mcu_gather(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  ushort uVar1;
  jpeg_entropy_encoder *pjVar2;
  JBLOCKROW paJVar3;
  _func_boolean_j_compress_ptr_JBLOCKROW_ptr *p_Var4;
  _func_void_j_compress_ptr *p_Var5;
  jpeg_error_mgr *pjVar6;
  uint uVar7;
  long lVar8;
  ushort uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  
  pjVar2 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    uVar7 = *(uint *)&pjVar2[2].encode_mcu;
    if ((*(uint *)&pjVar2[2].encode_mcu == 0) &&
       (uVar7 = cinfo->restart_interval, 0 < cinfo->comps_in_scan)) {
      lVar8 = 0;
      do {
        *(undefined4 *)((long)&pjVar2[1].encode_mcu + lVar8 * 4 + 4) = 0;
        lVar8 = lVar8 + 1;
      } while (lVar8 < cinfo->comps_in_scan);
      uVar7 = cinfo->restart_interval;
    }
    *(uint *)&pjVar2[2].encode_mcu = uVar7 - 1;
  }
  if (0 < cinfo->blocks_in_MCU) {
    lVar8 = 0;
    do {
      lVar15 = (long)cinfo->MCU_membership[lVar8];
      paJVar3 = MCU_data[lVar8];
      p_Var4 = (&pjVar2[5].encode_mcu)[cinfo->cur_comp_info[lVar15]->dc_tbl_no];
      p_Var5 = (&pjVar2[6].finish_pass)[cinfo->cur_comp_info[lVar15]->ac_tbl_no];
      uVar14 = 0;
      uVar7 = (int)(*paJVar3)[0] - *(int *)((long)&pjVar2[1].encode_mcu + lVar15 * 4 + 4);
      if (uVar7 != 0) {
        uVar13 = -uVar7;
        if (0 < (int)uVar7) {
          uVar13 = uVar7;
        }
        uVar14 = (ulong)uVar13;
        uVar7 = 0xffffffff;
        do {
          uVar13 = uVar7;
          uVar7 = uVar13 + 1;
          uVar10 = (uint)uVar14;
          uVar14 = uVar14 >> 1;
        } while (1 < uVar10);
        uVar14 = (ulong)(uVar13 + 2);
        if (10 < uVar7) {
          pjVar6 = cinfo->err;
          pjVar6->msg_code = 6;
          (*pjVar6->error_exit)((j_common_ptr)cinfo);
        }
      }
      *(long *)(p_Var4 + uVar14 * 8) = *(long *)(p_Var4 + uVar14 * 8) + 1;
      lVar16 = 1;
      uVar7 = 0;
      do {
        while (uVar13 = uVar7, uVar1 = (*paJVar3)[jpeg_natural_order[lVar16]], uVar1 == 0) {
          lVar16 = lVar16 + 1;
          uVar7 = uVar13 + 1;
          if (lVar16 == 0x40) {
            if (-1 < (int)uVar13) {
              *(long *)p_Var5 = *(long *)p_Var5 + 1;
            }
            goto LAB_00107a2c;
          }
        }
        if (0xf < (int)uVar13) {
          iVar12 = uVar13 - 0x1f;
          if (uVar13 < 0x1f) {
            iVar12 = 0;
          }
          uVar13 = (uVar13 - (iVar12 + 0xfU & 0x7ffffff0)) - 0x10;
          *(ulong *)(p_Var5 + 0x780) = *(long *)(p_Var5 + 0x780) + (ulong)(iVar12 + 0xfU >> 4) + 1;
        }
        uVar9 = -uVar1;
        if (0 < (short)uVar1) {
          uVar9 = uVar1;
        }
        iVar12 = 1;
        if (1 < uVar9) {
          uVar14 = (ulong)uVar9;
          uVar7 = 0;
          do {
            uVar10 = uVar7;
            uVar7 = uVar10 + 1;
            uVar11 = (uint)uVar14;
            uVar14 = uVar14 >> 1;
          } while (3 < uVar11);
          iVar12 = uVar10 + 2;
          if (9 < uVar7) {
            pjVar6 = cinfo->err;
            pjVar6->msg_code = 6;
            (*pjVar6->error_exit)((j_common_ptr)cinfo);
          }
        }
        *(long *)(p_Var5 + (long)(int)(uVar13 * 0x10 + iVar12) * 8) =
             *(long *)(p_Var5 + (long)(int)(uVar13 * 0x10 + iVar12) * 8) + 1;
        lVar16 = lVar16 + 1;
        uVar7 = 0;
      } while (lVar16 != 0x40);
LAB_00107a2c:
      *(int *)((long)&pjVar2[1].encode_mcu + lVar15 * 4 + 4) = (int)(*MCU_data[lVar8])[0];
      lVar8 = lVar8 + 1;
    } while (lVar8 < cinfo->blocks_in_MCU);
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_gather(j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr)cinfo->entropy;
  int blkn, ci;
  jpeg_component_info *compptr;

  /* Take care of restart intervals if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      /* Re-initialize DC predictions to 0 */
      for (ci = 0; ci < cinfo->comps_in_scan; ci++)
        entropy->saved.last_dc_val[ci] = 0;
      /* Update restart state */
      entropy->restarts_to_go = cinfo->restart_interval;
    }
    entropy->restarts_to_go--;
  }

  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    ci = cinfo->MCU_membership[blkn];
    compptr = cinfo->cur_comp_info[ci];
    htest_one_block(cinfo, MCU_data[blkn][0], entropy->saved.last_dc_val[ci],
                    entropy->dc_count_ptrs[compptr->dc_tbl_no],
                    entropy->ac_count_ptrs[compptr->ac_tbl_no]);
    entropy->saved.last_dc_val[ci] = MCU_data[blkn][0][0];
  }

  return TRUE;
}